

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUIFileOpenDialog::~CGUIFileOpenDialog(CGUIFileOpenDialog *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  code *pcVar3;
  int *piVar4;
  void *pvVar5;
  IGUIButton *pIVar6;
  _func_int *p_Var7;
  IGUIListBox *pIVar8;
  IGUIEditBox *pIVar9;
  IFileList *pIVar10;
  pointer pcVar11;
  pointer pwVar12;
  IFileSystem *pIVar13;
  
  pvVar5 = *vtt;
  *(void **)this = pvVar5;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar5 + -0x18)) = vtt[5];
  pIVar6 = this->CloseButton;
  if (pIVar6 != (IGUIButton *)0x0) {
    p_Var7 = (pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    pcVar3 = p_Var7 + 8 +
             (long)&(pIVar6->super_IGUIElement).Children.
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar3 = *(int *)pcVar3 + -1;
    if (*(int *)pcVar3 == 0) {
      (**(code **)(*(long *)(p_Var7 + (long)&(pIVar6->super_IGUIElement).super_IEventReceiver.
                                             _vptr_IEventReceiver) + 8))();
    }
  }
  pIVar6 = this->OKButton;
  if (pIVar6 != (IGUIButton *)0x0) {
    p_Var7 = (pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    pcVar3 = p_Var7 + 8 +
             (long)&(pIVar6->super_IGUIElement).Children.
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar3 = *(int *)pcVar3 + -1;
    if (*(int *)pcVar3 == 0) {
      (**(code **)(*(long *)(p_Var7 + (long)&(pIVar6->super_IGUIElement).super_IEventReceiver.
                                             _vptr_IEventReceiver) + 8))();
    }
  }
  pIVar6 = this->CancelButton;
  if (pIVar6 != (IGUIButton *)0x0) {
    p_Var7 = (pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    pcVar3 = p_Var7 + 8 +
             (long)&(pIVar6->super_IGUIElement).Children.
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar3 = *(int *)pcVar3 + -1;
    if (*(int *)pcVar3 == 0) {
      (**(code **)(*(long *)(p_Var7 + (long)&(pIVar6->super_IGUIElement).super_IEventReceiver.
                                             _vptr_IEventReceiver) + 8))();
    }
  }
  pIVar8 = this->FileBox;
  if (pIVar8 != (IGUIListBox *)0x0) {
    p_Var7 = (pIVar8->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    pcVar3 = p_Var7 + 8 +
             (long)&(pIVar8->super_IGUIElement).Children.
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar3 = *(int *)pcVar3 + -1;
    if (*(int *)pcVar3 == 0) {
      (**(code **)(*(long *)(p_Var7 + (long)&(pIVar8->super_IGUIElement).super_IEventReceiver.
                                             _vptr_IEventReceiver) + 8))();
    }
  }
  pIVar9 = this->FileNameText;
  if (pIVar9 != (IGUIEditBox *)0x0) {
    p_Var7 = (pIVar9->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    pcVar3 = p_Var7 + 8 +
             (long)&(pIVar9->super_IGUIElement).Children.
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar3 = *(int *)pcVar3 + -1;
    if (*(int *)pcVar3 == 0) {
      (**(code **)(*(long *)(p_Var7 + (long)&(pIVar9->super_IGUIElement).super_IEventReceiver.
                                             _vptr_IEventReceiver) + 8))();
    }
  }
  pIVar13 = this->FileSystem;
  if (pIVar13 != (IFileSystem *)0x0) {
    if ((int)(this->RestoreDirectory).str._M_string_length != 0) {
      (*pIVar13->_vptr_IFileSystem[0x12])(pIVar13,&this->RestoreDirectory);
      pIVar13 = this->FileSystem;
    }
    p_Var7 = pIVar13->_vptr_IFileSystem[-3];
    piVar4 = (int *)(&pIVar13->field_0x10 + (long)p_Var7);
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      (**(code **)(*(long *)((long)&pIVar13->_vptr_IFileSystem + (long)p_Var7) + 8))();
    }
  }
  pIVar10 = this->FileList;
  if (pIVar10 != (IFileList *)0x0) {
    p_Var7 = pIVar10->_vptr_IFileList[-3];
    piVar4 = (int *)(&pIVar10->field_0x10 + (long)p_Var7);
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      (**(code **)(*(long *)((long)&pIVar10->_vptr_IFileList + (long)p_Var7) + 8))();
    }
  }
  pcVar11 = (this->StartDirectory).str._M_dataplus._M_p;
  paVar1 = &(this->StartDirectory).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar11 != paVar1) {
    operator_delete(pcVar11,paVar1->_M_allocated_capacity + 1);
  }
  pcVar11 = (this->RestoreDirectory).str._M_dataplus._M_p;
  paVar1 = &(this->RestoreDirectory).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar11 != paVar1) {
    operator_delete(pcVar11,paVar1->_M_allocated_capacity + 1);
  }
  pwVar12 = (this->FileDirectoryFlatW).str._M_dataplus._M_p;
  paVar2 = &(this->FileDirectoryFlatW).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar12 != paVar2) {
    operator_delete(pwVar12,paVar2->_M_allocated_capacity * 4 + 4);
  }
  pcVar11 = (this->FileDirectoryFlat).str._M_dataplus._M_p;
  paVar1 = &(this->FileDirectoryFlat).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar11 != paVar1) {
    operator_delete(pcVar11,paVar1->_M_allocated_capacity + 1);
  }
  pcVar11 = (this->FileDirectory).str._M_dataplus._M_p;
  paVar1 = &(this->FileDirectory).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar11 != paVar1) {
    operator_delete(pcVar11,paVar1->_M_allocated_capacity + 1);
  }
  pwVar12 = (this->FileNameW).str._M_dataplus._M_p;
  paVar2 = &(this->FileNameW).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar12 != paVar2) {
    operator_delete(pwVar12,paVar2->_M_allocated_capacity * 4 + 4);
  }
  pcVar11 = (this->FileName).str._M_dataplus._M_p;
  paVar1 = &(this->FileName).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar11 != paVar1) {
    operator_delete(pcVar11,paVar1->_M_allocated_capacity + 1);
  }
  IGUIElement::~IGUIElement((IGUIElement *)this,vtt + 2);
  return;
}

Assistant:

CGUIFileOpenDialog::~CGUIFileOpenDialog()
{
	if (CloseButton)
		CloseButton->drop();

	if (OKButton)
		OKButton->drop();

	if (CancelButton)
		CancelButton->drop();

	if (FileBox)
		FileBox->drop();

	if (FileNameText)
		FileNameText->drop();

	if (FileSystem) {
		// revert to original CWD if path was set in constructor
		if (RestoreDirectory.size())
			FileSystem->changeWorkingDirectoryTo(RestoreDirectory);
		FileSystem->drop();
	}

	if (FileList)
		FileList->drop();
}